

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

ProcessorAndChannel * __thiscall
soul::heart::Parser::readProcessorAndChannel
          (ProcessorAndChannel *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int32_t iVar2;
  string name;
  string local_60;
  _Alloc_hider local_40;
  
  (__return_storage_ptr__->processor).object = (ProcessorInstance *)0x0;
  (__return_storage_ptr__->endpoint)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->endpoint).field_2;
  (__return_storage_ptr__->endpoint)._M_string_length = 0;
  (__return_storage_ptr__->endpoint).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>._M_payload
  .super__Optional_payload_base<unsigned_long>._M_engaged = false;
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_60,this);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29b542);
  if (bVar1) {
    findProcessorInstance((Parser *)&stack0xffffffffffffffc0,(string *)this);
    (__return_storage_ptr__->processor).object = (ProcessorInstance *)local_40._M_p;
    readGeneralIdentifier_abi_cxx11_((string *)&stack0xffffffffffffffc0,this);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->endpoint,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->endpoint);
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29b4de);
  if (bVar1) {
    iVar2 = parseInt32(this);
    if ((__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
      (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
    }
    (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)(long)iVar2;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x29aa2b);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

ProcessorAndChannel readProcessorAndChannel()
    {
        ProcessorAndChannel processorAndChannel;

        auto name = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::dot))
        {
            processorAndChannel.processor = findProcessorInstance (name);
            processorAndChannel.endpoint   = readGeneralIdentifier();
        }
        else
        {
            processorAndChannel.endpoint = name;
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            processorAndChannel.endpointIndex = parseInt32();

            expect (HEARTOperator::closeBracket);
        }

        return processorAndChannel;
    }